

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

void CVmObjBigNum::set_dig(char *ext,size_t i,uint dig)

{
  long lVar1;
  uchar mask;
  uint dig_local;
  size_t i_local;
  char *ext_local;
  
  lVar1 = (i >> 1) + 5;
  ext[lVar1] = ext[lVar1] & (byte)(0xf << (sbyte)((i & 1) << 2));
  lVar1 = (i >> 1) + 5;
  ext[lVar1] = ext[lVar1] | (byte)((dig & 0xf) << (('\x01' - ((byte)i & 1)) * '\x04' & 0x1f));
  return;
}

Assistant:

static void set_dig(char *ext, size_t i, unsigned int dig)
    {
        unsigned char mask;

        /* make sure our input digit is just a digit */
        dig &= 0x0F;

        /* 
         *   If it's an even index, we need to store our digit in the high
         *   half.  Otherwise, we need to store it in the low half.  So,
         *   if we're storing in an even index, shift our number left 4
         *   bits so that it's in the high half of its low byte;
         *   otherwise, leave the number as-is.  
         */
        dig <<= ((1 - (i & 1)) << 2);

        /*
         *   We need a mask that we can AND the current value with to
         *   preserve the half we're not changing, but clear the other
         *   half.  So, we need 0x0F if we're setting the high half (even
         *   index), or 0xF0 if we're setting the low half (odd index).
         *   Use the same trick as above, with the shift sense inverted,
         *   so generate our mask.  
         */
        mask = (0x0F << ((i & 1) << 2));
        
        /* mask out our part from the pair */
        ext[VMBN_MANT + i/2] &= mask;

        /* OR in our digit now that we've masked the place clear */
        ext[VMBN_MANT + i/2] |= (unsigned char)dig;
    }